

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O2

iterator __thiscall KDIS::DATA_TYPE::Mine::getWire(Mine *this,KUINT16 Index)

{
  iterator iVar1;
  KException *this_00;
  allocator<char> local_3b;
  KUINT16 Index_local;
  KString local_38;
  
  Index_local = Index;
  iVar1 = std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>_>
          ::find(&(this->m_mvVertices)._M_t,&Index_local);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header)
  {
    return (iterator)iVar1._M_node;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"getWire",&local_3b);
  KException::KException<char_const*>(this_00,&local_38,7,"Invalid Wire Index.");
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

map<KUINT16, vector<Vector> >::iterator Mine::getWire(KUINT16 Index) noexcept(false)
{
    map< KUINT16, vector<Vector> >::iterator itr = m_mvVertices.find( Index );
    if( itr == m_mvVertices.end() )throw KException( __FUNCTION__, OUT_OF_BOUNDS, "Invalid Wire Index." );
    return itr;
}